

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  float *out_g;
  ImVec2 *pIVar1;
  long lVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *this;
  ImDrawIdx *pIVar4;
  ImDrawVert *pIVar5;
  ImVec2 *pIVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  uint uVar9;
  ImU32 IVar10;
  ImU32 IVar11;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  undefined7 extraout_var_01;
  long lVar12;
  byte bVar13;
  char cVar14;
  ImGuiContext *pIVar15;
  uint uVar16;
  uint uVar17;
  ImGuiContext *g;
  ImGuiContext *out_h;
  ulong uVar18;
  bool bVar19;
  int iVar20;
  float fVar21;
  int iVar22;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  int extraout_XMM0_Db_01;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  int extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  ImVec2 IVar23;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar24;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float V;
  ImVec2 picker_pos;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  undefined1 local_24c [4];
  float local_248;
  float local_244;
  uint local_240;
  float local_23c;
  ImVec2 *local_238;
  float local_22c;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  ImVec2 local_218;
  float local_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  ImVec2 local_1f0;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  ImU32 local_1c4;
  ImU32 local_1c0;
  uint local_1bc;
  ImVec2 local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  int local_198;
  int local_194;
  uint local_190;
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  uint uStack_170;
  uint uStack_16c;
  ImVec2 local_160;
  float local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  ImGuiContext *local_140;
  undefined1 local_138 [8];
  ImVec2 local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  ImVec2 local_100;
  ImVec2 local_f8;
  ImU32 local_ec;
  ImVec4 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  size_t local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  float local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar33 [16];
  
  pIVar15 = GImGui;
  local_118._8_8_ = local_118._0_8_;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems != false) {
    bVar13 = 0;
    goto LAB_00150857;
  }
  _fStack_1d0 = local_1d8;
  local_1d8 = (undefined1  [8])ref_col;
  this = pIVar3->DrawList;
  local_228._0_4_ = CalcItemWidth();
  local_228._4_4_ = extraout_XMM0_Db;
  uStack_220._0_4_ = extraout_XMM0_Dc;
  uStack_220._4_4_ = (float)extraout_XMM0_Dd;
  (pIVar15->NextItemData).Flags = 0;
  local_118._0_8_ = label;
  PushID(label);
  BeginGroup();
  uVar17 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar17);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar9 = pIVar15->ColorEditOptions & 0x6000000;
    ref_col = (float *)0x2000000;
    if (uVar9 != 0) {
      ref_col = (float *)(ulong)uVar9;
    }
    uVar17 = uVar17 | (uint)ref_col;
  }
  if ((uVar17 & 0x18000000) == 0) {
    uVar9 = pIVar15->ColorEditOptions & 0x18000000;
    ref_col = (float *)0x8000000;
    if (uVar9 != 0) {
      ref_col = (float *)(ulong)uVar9;
    }
    uVar17 = uVar17 | (uint)ref_col;
  }
  if ((uVar17 & 8) == 0) {
    uVar17 = uVar17 | pIVar15->ColorEditOptions & 0x10000U;
  }
  local_1bc = uVar17 & 0x10002;
  bVar19 = local_1bc == 0x10000;
  local_218 = (pIVar3->DC).CursorPos;
  local_238 = (ImVec2 *)col;
  local_158 = GetFrameHeight();
  pIVar1 = local_238;
  fVar29 = (pIVar15->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar29);
  fVar29 = (float)local_228._0_4_ - (local_158 + fVar29) * (float)(byte)(bVar19 + 1);
  uVar9 = -(uint)(fVar29 <= local_158);
  fStack_174 = (float)(local_228._4_4_ & extraout_XMM0_Db_00);
  uStack_170 = (uint)uStack_220 & extraout_XMM0_Dc_00;
  uStack_16c = (uint)uStack_220._4_4_ & extraout_XMM0_Dd_00;
  local_178 = (float)(uVar9 & (uint)local_158 | ~uVar9 & (uint)fVar29);
  local_b8 = (ulong)((uVar17 & 2) == 0) * 4 + 0xc;
  uStack_154 = extraout_XMM0_Db_00;
  uStack_150 = extraout_XMM0_Dc_00;
  uStack_14c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_238,local_b8);
  local_22c = local_178 * 0.08;
  local_a8 = ZEXT416((uint)(local_178 * 0.5));
  local_1b0.x = local_178 * 0.5 - local_22c;
  _local_c8 = ZEXT416((uint)local_1b0.x);
  local_1f0.x = (local_158 + local_178) * 0.5 + local_218.x;
  local_1f0.y = local_178 * 0.5 + local_218.y;
  local_228._0_4_ = local_218.x + local_178 + (float)local_128._0_4_;
  local_1b0.x = local_1b0.x - (float)(int)(local_178 * 0.027);
  local_160.x = local_1b0.x * -0.5;
  local_160.y = local_1b0.x * -0.866025;
  local_1b0.y = 0.0;
  local_1b8.y = local_1b0.x * 0.866025;
  local_24c = (undefined1  [4])pIVar1->x;
  local_248 = pIVar1->y;
  local_244 = pIVar1[1].x;
  local_140 = pIVar15;
  local_228._4_4_ = local_218.y;
  uStack_220 = 0;
  local_1e4 = local_244;
  local_1e0 = local_248;
  local_1dc = (float)local_24c;
  local_1b8.x = local_160.x;
  if ((uVar17 >> 0x1b & 1) == 0) {
    out_h = pIVar15;
    fVar29 = (float)local_228._0_4_;
    if ((uVar17 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_1dc,&local_1e0,&local_1e4);
      goto LAB_0014f083;
    }
  }
  else {
    out_h = (ImGuiContext *)local_24c;
    ref_col = &local_244;
    ColorConvertRGBtoHSV((float)local_24c,local_248,local_244,(float *)out_h,&local_248,ref_col);
    pIVar15 = local_140;
    ColorEditRestoreHS(&pIVar1->x,(float *)out_h,&local_248,ref_col);
LAB_0014f083:
    fVar29 = (float)local_228._0_4_;
  }
  local_208._4_4_ = uStack_154;
  local_208._0_4_ = local_158 + fVar29;
  fStack_200 = (float)uStack_150;
  fStack_1fc = (float)uStack_14c;
  PushItemFlag(8,true);
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) == 0) {
      local_23c = 0.0;
      local_240 = 0;
      uVar18 = 0;
    }
    else {
      local_1a8.y = local_178;
      local_1a8.x = local_178;
      local_23c = 0.0;
      InvisibleButton("sv",&local_1a8,0);
      bVar19 = IsItemActive();
      if (bVar19) {
        auVar35._0_4_ = local_178 + -1.0;
        IVar23 = (pIVar15->IO).MousePos;
        auVar25._0_4_ = IVar23.x - local_218.x;
        auVar25._4_4_ = IVar23.y - local_218.y;
        auVar25._8_8_ = 0;
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = auVar35._0_4_;
        auVar35._12_4_ = auVar35._0_4_;
        auVar35 = divps(auVar25,auVar35);
        local_244 = 1.0;
        fVar29 = auVar35._0_4_;
        fVar21 = auVar35._4_4_;
        iVar22 = -(uint)(fVar29 < 0.0);
        iVar20 = -(uint)(fVar21 < 0.0);
        auVar34._4_4_ = iVar20;
        auVar34._0_4_ = iVar22;
        auVar34._8_4_ = iVar20;
        auVar34._12_4_ = iVar20;
        auVar33._8_8_ = auVar34._8_8_;
        auVar33._4_4_ = iVar22;
        auVar33._0_4_ = iVar22;
        uVar9 = movmskpd((int)CONCAT71(extraout_var,bVar19),auVar33);
        local_248 = 0.0;
        if (((uVar9 & 1) == 0) && (local_248 = 1.0, fVar29 <= 1.0)) {
          local_248 = fVar29;
        }
        if ((uVar9 & 2) == 0) {
          auVar30 = ZEXT812(0x3f800000);
          if (fVar21 <= auVar30._0_4_) {
            auVar30._4_8_ = auVar30._4_8_;
            auVar30._0_4_ = fVar21;
          }
          local_244 = 1.0 - auVar30._0_4_;
        }
        IVar11 = pIVar15->ColorEditLastColor;
        fStack_1a0 = local_238[1].x;
        local_1a8 = *local_238;
        fStack_19c = 0.0;
        IVar10 = ColorConvertFloat4ToU32((ImVec4 *)&local_1a8);
        local_23c = (float)CONCAT71((int7)((ulong)ref_col >> 8),1);
        if (IVar11 == IVar10) {
          local_24c = (undefined1  [4])pIVar15->ColorEditLastHue;
        }
      }
      if ((uVar17 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_1a8.y = local_218.y;
      local_1a8.x = (float)local_228._0_4_;
      SetCursorScreenPos(&local_1a8);
      local_1a8.y = local_178;
      local_1a8.x = local_158;
      local_240 = 0;
      InvisibleButton("hue",&local_1a8,0);
      bVar19 = IsItemActive();
      if (bVar19) {
        fVar21 = ((pIVar15->IO).MousePos.y - local_218.y) / (local_178 + -1.0);
        fVar29 = 1.0;
        if (fVar21 <= 1.0) {
          fVar29 = fVar21;
        }
        local_24c = (undefined1  [4])(~-(uint)(fVar21 < 0.0) & (uint)fVar29);
        local_240 = (uint)CONCAT71(extraout_var_00,1);
        uVar18 = CONCAT71((int7)((ulong)out_h >> 8),1);
      }
      else {
        uVar18 = (ulong)(uint)local_23c;
      }
    }
  }
  else {
    local_1a8.y = local_178;
    local_1a8.x = (pIVar15->Style).ItemInnerSpacing.x + local_178 + local_158;
    local_23c = 0.0;
    InvisibleButton("hsv",&local_1a8,0);
    bVar19 = IsItemActive();
    local_240 = 0;
    uVar18 = 0;
    if (bVar19) {
      fVar24 = (pIVar15->IO).MouseClickedPos[0].x - local_1f0.x;
      fVar36 = (pIVar15->IO).MouseClickedPos[0].y - local_1f0.y;
      fVar21 = (pIVar15->IO).MousePos.x - local_1f0.x;
      local_188 = ZEXT416((uint)fVar21);
      fVar29 = (pIVar15->IO).MousePos.y - local_1f0.y;
      local_88 = ZEXT416((uint)fVar29);
      local_78 = ZEXT416((uint)fVar36);
      local_d8 = ZEXT416((uint)fVar24);
      fVar24 = fVar24 * fVar24 + fVar36 * fVar36;
      if ((fVar24 < ((float)local_c8._0_4_ + -1.0) * ((float)local_c8._0_4_ + -1.0)) ||
         (((float)local_a8._0_4_ + 1.0) * ((float)local_a8._0_4_ + 1.0) < fVar24)) {
        local_240 = 0;
      }
      else {
        fVar29 = atan2f(fVar29,fVar21);
        fVar29 = (fVar29 / 3.1415927) * 0.5;
        local_24c = (undefined1  [4])
                    (~-(uint)(fVar29 < 0.0) & (uint)fVar29 |
                    (uint)(fVar29 + 1.0) & -(uint)(fVar29 < 0.0));
        local_240 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_98 = cosf((float)local_24c * -2.0 * 3.1415927);
      fVar29 = sinf((float)local_24c * -2.0 * 3.1415927);
      uVar8 = local_d8._0_4_;
      local_d8._4_4_ = extraout_XMM0_Db_01;
      local_d8._0_4_ = fVar29;
      local_d8._8_4_ = extraout_XMM0_Dc_01;
      local_d8._12_4_ = extraout_XMM0_Dd_01;
      local_1a8.x = local_98 * (float)uVar8 + -(float)local_78._0_4_ * fVar29;
      local_1a8.y = fVar29 * (float)uVar8 + local_98 * (float)local_78._0_4_;
      bVar19 = ImTriangleContainsPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
      if (bVar19) {
        local_1a8.x = local_98 * (float)local_188._0_4_ +
                      -(float)local_88._0_4_ * (float)local_d8._0_4_;
        local_1a8.y = (float)local_d8._0_4_ * (float)local_188._0_4_ +
                      local_98 * (float)local_88._0_4_;
        bVar19 = ImTriangleContainsPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
        if (!bVar19) {
          local_1a8 = ImTriangleClosestPoint(&local_1b0,&local_160,&local_1b8,&local_1a8);
        }
        ImTriangleBarycentricCoords
                  (&local_1b0,&local_160,&local_1b8,&local_1a8,&local_e8.x,(float *)local_138,
                   &local_f8.x);
        fVar21 = 1.0 - (float)local_138._0_4_;
        fVar29 = 1.0;
        if (fVar21 <= 1.0) {
          fVar29 = fVar21;
        }
        local_244 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar29);
        fVar21 = local_e8.x / local_244;
        fVar29 = 1.0;
        if (fVar21 <= 1.0) {
          fVar29 = fVar21;
        }
        local_248 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar29);
        local_23c = (float)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar18 = 1;
      }
      else {
        local_23c = 0.0;
        uVar18 = (ulong)local_240;
      }
    }
    if ((uVar17 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_208._0_4_;
  if (local_1bc == 0x10000) {
    local_1a8.y = local_218.y;
    local_1a8.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_1a8);
    local_1a8.y = local_178;
    local_1a8.x = local_158;
    InvisibleButton("alpha",&local_1a8,0);
    bVar19 = IsItemActive();
    if (bVar19) {
      fVar21 = ((pIVar15->IO).MousePos.y - local_218.y) / (local_178 + -1.0);
      fVar29 = 1.0;
      if (fVar21 <= 1.0) {
        fVar29 = fVar21;
      }
      local_238[1].y =
           (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                  ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar29));
      uVar18 = CONCAT71((int7)(uVar18 >> 8),1);
    }
  }
  uVar9 = (uint)uVar18;
  PopItemFlag();
  if ((uVar17 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar15->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if (-1 < (char)uVar17) {
    uVar7 = local_118._0_8_;
    text_end = FindRenderedTextEnd((char *)local_118._0_8_,(char *)0x0);
    if (text_end != (char *)uVar7) {
      if ((uVar17 >> 8 & 1) != 0) {
        SameLine(0.0,(pIVar15->Style).ItemInnerSpacing.x);
      }
      TextEx((char *)local_118._0_8_,text_end,0);
    }
  }
  if ((uVar17 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_1a8 = *local_238;
    fStack_1a0 = local_238[1].x;
    if ((uVar17 & 2) == 0) {
      fStack_19c = local_238[1].y;
    }
    else {
      fStack_19c = 1.0;
    }
    if ((char)uVar17 < '\0') {
      Text("Current");
    }
    IVar23.x = local_158 * 3.0;
    IVar23.y = local_158 * 2.0;
    local_118._8_4_ = local_158 * 0.0;
    local_118._0_4_ = IVar23.x;
    local_118._4_4_ = IVar23.y;
    local_118._12_4_ = local_158 * 0.0;
    ColorButton("##current",(ImVec4 *)&local_1a8,uVar17 & 0x180e0040,IVar23);
    if (local_1d8 != (undefined1  [8])0x0) {
      Text("Original");
      local_e8._0_8_ = *(undefined8 *)local_1d8;
      local_e8.z = *(float *)((long)local_1d8 + 8);
      if ((uVar17 & 2) == 0) {
        local_e8.w = *(float *)((long)local_1d8 + 0xc);
      }
      else {
        local_e8.w = 1.0;
      }
      bVar19 = ColorButton("##original",&local_e8,uVar17 & 0x180e0040,(ImVec2)local_118._0_8_);
      if (bVar19) {
        memcpy(local_238,(void *)local_1d8,local_b8);
        uVar9 = (uint)CONCAT71((int7)(uVar18 >> 8),1);
      }
    }
    local_188._0_4_ = uVar9;
    PopItemFlag();
    EndGroup();
  }
  else {
    local_188._0_4_ = uVar9;
  }
  pIVar6 = local_238;
  out_g = &local_238->y;
  pIVar1 = local_238 + 1;
  if (((char)local_240 != '\0') || (local_23c._0_1_ != '\0')) {
    if ((uVar17 >> 0x1b & 1) == 0) {
      if ((uVar17 >> 0x1c & 1) != 0) {
        local_238->x = (float)local_24c;
        local_238->y = local_248;
        local_238[1].x = local_244;
      }
    }
    else {
      ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_238->x,out_g,&pIVar1->x);
      pIVar15->ColorEditLastHue = (float)local_24c;
      pIVar15->ColorEditLastSat = local_248;
      fStack_1a0 = pIVar6[1].x;
      local_1a8 = *pIVar6;
      fStack_19c = 0.0;
      IVar11 = ColorConvertFloat4ToU32((ImVec4 *)&local_1a8);
      pIVar15->ColorEditLastColor = IVar11;
    }
  }
  cVar14 = '\x01';
  fVar29 = local_158 * 0.2;
  fVar21 = 0.0;
  fVar24 = 0.0;
  fVar36 = 0.0;
  if ((uVar17 & 0x20) == 0) {
    _local_1d8 = ZEXT416((uint)(local_158 * 0.2));
    fVar29 = (float)local_128._0_4_;
    if (local_1bc != 0x10000) {
      fVar29 = (float)local_228._0_4_;
    }
    PushItemWidth((fVar29 + local_158) - local_218.x);
    uVar9 = uVar17 & 0x198e001a;
    cVar14 = '\x01';
    if (((uVar17 >> 0x14 & 1) != 0 || (uVar17 & 0x600000) == 0) &&
       (bVar19 = ColorEdit4("##rgb",&local_238->x,uVar9 | 0x100004), bVar19)) {
      local_188._0_4_ = (undefined4)CONCAT71(extraout_var_01,1);
      if (local_140->ActiveId == 0) {
        cVar14 = '\x01';
      }
      else {
        cVar14 = local_140->ActiveIdAllowOverlap;
      }
    }
    if ((uVar17 >> 0x15 & 1) != 0 || (uVar17 & 0x500000) == 0) {
      bVar19 = ColorEdit4("##hsv",&local_238->x,uVar9 | 0x200004);
      local_188._0_4_ = CONCAT31(SUB43(local_188._0_4_,1),(byte)local_188._0_4_ | bVar19);
    }
    if ((uVar17 >> 0x16 & 1) != 0 || (uVar17 & 0x300000) == 0) {
      bVar19 = ColorEdit4("##hex",&local_238->x,uVar9 | 0x400004);
      local_188._0_4_ = CONCAT31(SUB43(local_188._0_4_,1),(byte)local_188._0_4_ | bVar19);
    }
    PopItemWidth();
    fVar29 = (float)local_1d8._0_4_;
    fVar21 = (float)local_1d8._4_4_;
    fVar24 = fStack_1d0;
    fVar36 = fStack_1cc;
  }
  pIVar6 = local_238;
  iVar22 = (int)fVar29;
  fVar29 = (float)(int)fVar21;
  fVar21 = (float)(int)fVar24;
  fVar24 = (float)(int)fVar36;
  if (((uVar17 >> 0x1b & 1) != 0) && (cVar14 == '\0')) {
    local_1d8._4_4_ = fVar29;
    local_1d8._0_4_ = iVar22;
    fStack_1d0 = fVar21;
    fStack_1cc = fVar24;
    ColorConvertRGBtoHSV
              (local_238->x,local_238->y,local_238[1].x,&local_1a8.x,&local_e8.x,(float *)local_138)
    ;
    if ((local_1a8.x <= 0.0) && (0.0 < (float)local_24c)) {
      if (0.0 < (float)local_138._0_4_) {
LAB_0014fb3d:
        if (0.0 < local_e8.x) goto LAB_0014fb63;
        fVar29 = local_248 * 0.5;
      }
      else {
        if ((local_244 == (float)local_138._0_4_) &&
           (!NAN(local_244) && !NAN((float)local_138._0_4_))) goto LAB_0014fb3d;
        local_138._0_4_ = local_244 * 0.5;
        fVar29 = local_248;
      }
      ColorConvertHSVtoRGB
                ((float)local_24c,fVar29,(float)local_138._0_4_,&pIVar6->x,out_g,&pIVar1->x);
    }
LAB_0014fb63:
    iVar22 = local_1d8._0_4_;
    fVar29 = (float)local_1d8._4_4_;
    fVar21 = fStack_1d0;
    fVar24 = fStack_1cc;
  }
  pIVar15 = local_140;
  uVar9 = local_188._0_4_;
  pIVar1 = local_238;
  local_68 = (float)iVar22;
  fStack_64 = (float)(int)fVar29;
  fStack_60 = (float)(int)fVar21;
  fStack_5c = (float)(int)fVar24;
  if ((char)local_188._0_4_ != '\0') {
    if ((uVar17 >> 0x1b & 1) == 0) {
      if ((uVar17 >> 0x1c & 1) != 0) {
        local_24c = (undefined1  [4])local_238->x;
        local_248 = local_238->y;
        local_244 = local_238[1].x;
        ColorConvertHSVtoRGB((float)local_24c,local_248,local_244,&local_1dc,&local_1e0,&local_1e4);
      }
    }
    else {
      local_1dc = local_238->x;
      local_1e0 = local_238->y;
      local_1e4 = local_238[1].x;
      ColorConvertRGBtoHSV(local_1dc,local_1e0,local_1e4,(float *)local_24c,&local_248,&local_244);
      uVar9 = local_188._0_4_;
      ColorEditRestoreHS(&pIVar1->x,(float *)local_24c,&local_248,&local_244);
    }
  }
  local_e8.w = (pIVar15->Style).Alpha;
  fVar29 = 1.0;
  if (local_e8.w <= 1.0) {
    fVar29 = local_e8.w;
  }
  iVar22 = (int)((float)(~-(uint)(local_e8.w < 0.0) & (uint)fVar29) * 255.0 + 0.5);
  local_e8.x = 1.0;
  local_e8.y = 1.0;
  local_e8.z = 1.0;
  uVar16 = iVar22 * 0x1000000;
  local_b0 = (ulong)uVar16;
  local_198 = uVar16 + 0xff0000;
  local_190 = iVar22 << 0x18 | 0xff;
  fStack_1a0 = (float)(iVar22 << 0x18 | 0xff00);
  fStack_19c = (float)(iVar22 << 0x18 | 0xffff00);
  local_20c = (float)(uVar16 + 0xffffff);
  local_1a8 = (ImVec2)(CONCAT44(iVar22 << 0x18,iVar22 << 0x18) | 0xffff000000ff);
  local_194 = uVar16 + 0xff00ff;
  local_1c0 = uVar16 + 0x808080;
  ColorConvertHSVtoRGB((float)local_24c,1.0,1.0,&local_e8.x,&local_e8.y,&local_e8.z);
  IVar10 = ColorConvertFloat4ToU32(&local_e8);
  local_138._4_4_ = local_1e0;
  local_138._0_4_ = local_1dc;
  local_130.y = (pIVar15->Style).Alpha;
  local_130.x = local_1e4;
  IVar11 = ColorConvertFloat4ToU32((ImVec4 *)local_138);
  fVar29 = local_20c;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) != 0) {
      local_1d8._4_4_ = local_178;
      local_1d8._0_4_ = local_178;
      fStack_1d0 = local_178;
      fStack_1cc = local_178;
      local_138._0_4_ = local_218.x + local_178;
      local_138._4_4_ = local_218.y + local_178;
      local_1c4 = IVar11;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_138,(ImU32)local_20c,IVar10,IVar10,(ImU32)local_20c
                );
      local_138._0_4_ = local_218.x + (float)local_1d8._0_4_;
      local_138._4_4_ = local_218.y + (float)local_1d8._4_4_;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_218,(ImVec2 *)local_138,0,0,(ImU32)local_b0,(ImU32)local_b0);
      p_max.x = (float)local_1d8._0_4_ + local_218.x;
      p_max.y = (float)local_1d8._4_4_ + local_218.y;
      RenderFrameBorder(local_218,p_max,0.0);
      auVar31._4_4_ = 1.0 - local_244;
      auVar31._0_4_ = local_248;
      auVar31._8_8_ = 0;
      auVar35 = minps(_DAT_00160460,auVar31);
      fVar29 = local_218.x;
      fVar21 = local_218.y;
      auVar26._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_248) & auVar35._0_4_) * (float)local_1d8._0_4_
                        + fVar29 + 0.5);
      auVar26._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_244) & auVar35._4_4_) *
                        (float)local_1d8._4_4_ + fVar21 + 0.5);
      auVar26._8_4_ = (float)(int)(auVar35._8_4_ * fStack_1d0 + 0.0 + 0.0);
      auVar26._12_4_ = (float)(int)(auVar35._12_4_ * fStack_1cc + 0.0 + 0.0);
      auVar32._0_4_ = (float)local_1d8._0_4_ + fVar29 + -2.0;
      auVar32._4_4_ = (float)local_1d8._4_4_ + fVar21 + -2.0;
      auVar32._8_4_ = fStack_1d0 + 0.0 + 0.0;
      auVar32._12_4_ = fStack_1cc + 0.0 + 0.0;
      auVar35 = minps(auVar32,auVar26);
      uVar17 = -(uint)(auVar26._0_4_ < fVar29 + 2.0);
      uVar9 = -(uint)(auVar26._4_4_ < fVar21 + 2.0);
      local_f8 = (ImVec2)(CONCAT44(~uVar9 & auVar35._4_4_,~uVar17 & auVar35._0_4_) |
                         CONCAT44((uint)(fVar21 + 2.0) & uVar9,(uint)(fVar29 + 2.0) & uVar17));
      local_1d8._4_4_ = fStack_174;
      local_1d8._0_4_ = local_178 / 6.0;
      fStack_1d0 = (float)uStack_170;
      fStack_1cc = (float)uStack_16c;
      lVar12 = 0;
      do {
        lVar2 = lVar12 + 1;
        local_138._4_4_ = (float)(int)lVar12 * (float)local_1d8._0_4_ + local_218.y;
        local_138._0_4_ = local_228._0_4_;
        local_100.y = (float)(int)lVar2 * (float)local_1d8._0_4_ + local_218.y;
        local_100.x = (float)local_208._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_138,&local_100,(ImU32)(&local_1a8.x)[lVar12],
                   (ImU32)(&local_1a8.x)[lVar12],(ImU32)(&local_1a8.y)[lVar12],
                   (ImU32)(&local_1a8.y)[lVar12]);
        lVar12 = lVar2;
      } while (lVar2 != 6);
      _local_1d8 = ZEXT416((uint)(float)(int)((float)local_24c * local_178 + local_218.y + 0.5));
      p_min.y = local_218.y;
      p_min.x = (float)local_228._0_4_;
      p_max_00.y = local_178 + local_218.y;
      p_max_00.x = (float)local_208._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_228._0_4_ + -1.0;
      pos.y = (float)local_1d8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_158 + 2.0,(pIVar15->Style).Alpha);
      uVar9 = local_188._0_4_;
      IVar11 = local_1c4;
    }
  }
  else {
    local_d8 = ZEXT416((uint)(0.5 / (float)local_a8._0_4_));
    iVar22 = 4;
    if (4 < (int)(float)local_a8._0_4_ / 0xc) {
      iVar22 = (int)(float)local_a8._0_4_ / 0xc;
    }
    local_78._0_4_ = iVar22;
    local_88._4_4_ = -0x80000000;
    local_88._0_4_ = -(0.5 / (float)local_a8._0_4_);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_a8._0_4_ = (float)local_a8._0_4_ + (float)local_c8._0_4_;
    local_98 = (float)local_a8._0_4_ * 0.5;
    local_c8._4_4_ = local_c8._0_4_;
    fStack_c0 = (float)local_c8._0_4_;
    fStack_bc = (float)local_c8._0_4_;
    lVar12 = 0;
    local_1c4 = IVar11;
    local_ec = IVar10;
    do {
      fVar21 = (float)(int)lVar12 / 6.0;
      fVar21 = (fVar21 + fVar21) * 3.1415927 + (float)local_88._0_4_;
      fVar24 = ((float)(int)lVar12 + 1.0) / 6.0;
      fVar24 = (fVar24 + fVar24) * 3.1415927 + (float)local_d8._0_4_;
      local_1d8._0_4_ = fVar24;
      iVar22 = (this->VtxBuffer).Size;
      local_118._0_4_ = fVar21;
      ImDrawList::PathArcTo(this,&local_1f0,local_98,fVar21,fVar24,local_78._0_4_);
      ImDrawList::AddPolyline(this,(this->_Path).Data,(this->_Path).Size,(ImU32)fVar29,0,local_22c);
      (this->_Path).Size = 0;
      iVar20 = (this->VtxBuffer).Size;
      _local_208 = ZEXT416((uint)local_1f0.x);
      local_228._0_4_ = cosf((float)local_118._0_4_);
      local_228._4_4_ = extraout_XMM0_Db_02;
      uStack_220._0_4_ = extraout_XMM0_Dc_02;
      uStack_220._4_4_ = (float)extraout_XMM0_Dd_02;
      auVar27._4_4_ = local_1f0.y;
      auVar27._0_4_ = local_208._0_4_;
      auVar27._8_4_ = local_208._4_4_;
      auVar27._12_4_ = 0;
      _local_208 = auVar27;
      fVar21 = sinf((float)local_118._0_4_);
      fVar24 = (float)local_228._4_4_ * fStack_c0;
      local_228._4_4_ = fVar21 * (float)local_c8._4_4_ + (float)local_208._4_4_;
      local_228._0_4_ = (float)local_228._0_4_ * (float)local_c8._0_4_ + (float)local_208._0_4_;
      uStack_220._0_4_ = (uint)(fVar24 + fStack_200);
      uStack_220._4_4_ = extraout_XMM0_Db_03 * fStack_bc + fStack_1fc;
      _local_208 = ZEXT416((uint)local_1f0.x);
      local_118._0_4_ = cosf((float)local_1d8._0_4_);
      local_118._4_4_ = extraout_XMM0_Db_04;
      local_118._8_4_ = extraout_XMM0_Dc_03;
      local_118._12_4_ = extraout_XMM0_Dd_03;
      auVar28._4_4_ = local_1f0.y;
      auVar28._0_4_ = local_208._0_4_;
      auVar28._8_4_ = local_208._4_4_;
      auVar28._12_4_ = 0;
      _local_208 = auVar28;
      fVar21 = sinf((float)local_1d8._0_4_);
      gradient_p1.x = (float)local_118._0_4_ * (float)local_c8._0_4_ + (float)local_208._0_4_;
      gradient_p1.y = fVar21 * (float)local_c8._4_4_ + (float)local_208._4_4_;
      lVar2 = lVar12 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar22,iVar20,(ImVec2)local_228,gradient_p1,(ImU32)(&local_1a8.x)[lVar12],
                 (ImU32)(&local_1a8.y)[lVar12]);
      lVar12 = lVar2;
    } while (lVar2 != 6);
    local_228._0_4_ = cosf(((float)local_24c + (float)local_24c) * 3.1415927);
    local_228._4_4_ = extraout_XMM0_Db_05;
    uStack_220._0_4_ = extraout_XMM0_Dc_04;
    uStack_220._4_4_ = (float)extraout_XMM0_Dd_04;
    local_208._0_4_ = sinf(((float)local_24c + (float)local_24c) * 3.1415927);
    IVar11 = local_ec;
    pIVar15 = local_140;
    fVar29 = local_20c;
    local_208._4_4_ = extraout_XMM0_Db_06;
    fStack_200 = (float)extraout_XMM0_Dc_05;
    fStack_1fc = (float)extraout_XMM0_Dd_05;
    local_138._0_4_ = (float)local_228._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1f0.x;
    local_138._4_4_ = (float)local_208._0_4_ * (float)local_a8._0_4_ * 0.5 + local_1f0.y;
    if ((char)local_240 == '\0') {
      fVar21 = 0.55;
    }
    else {
      fVar21 = 0.65;
    }
    local_22c = local_22c * fVar21;
    iVar22 = 0x20;
    if ((int)(local_22c / 1.4) < 0x20) {
      iVar22 = (int)(local_22c / 1.4);
    }
    iVar20 = 9;
    if (9 < iVar22) {
      iVar20 = iVar22;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_138,local_22c,local_ec,iVar20);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_22c + 1.0,local_1c0,iVar20,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_138,local_22c,(ImU32)fVar29,iVar20,1.0);
    local_100.x = local_1b0.x * (float)local_228._0_4_ + -local_1b0.y * (float)local_208._0_4_ +
                  local_1f0.x;
    local_100.y = local_1b0.x * (float)local_208._0_4_ + local_1b0.y * (float)local_228._0_4_ +
                  local_1f0.y;
    local_38.x = local_160.x * (float)local_228._0_4_ + -local_160.y * (float)local_208._0_4_ +
                 local_1f0.x;
    local_38.y = local_160.x * (float)local_208._0_4_ + local_160.y * (float)local_228._0_4_ +
                 local_1f0.y;
    local_40.x = local_1b8.x * (float)local_228._0_4_ + -local_1b8.y * (float)local_208._0_4_ +
                 local_1f0.x;
    local_40.y = local_1b8.x * (float)local_208._0_4_ + local_1b8.y * (float)local_228._0_4_ +
                 local_1f0.y;
    IVar23 = GetFontTexUvWhitePixel();
    uStack_220 = extraout_XMM0_Qb;
    local_228._0_4_ = IVar23.x;
    local_228._4_4_ = IVar23.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar35 = _local_228;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar4 + 1;
    this->_VtxWritePtr->pos = local_100;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = IVar11;
    this->_VtxWritePtr = pIVar5 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar5[1].pos = local_38;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = IVar11;
    this->_VtxWritePtr = pIVar5 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar5[1].pos = local_40;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = (ImU32)fVar29;
    this->_VtxWritePtr = pIVar5 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar5[1].pos = local_100;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = 0;
    this->_VtxWritePtr = pIVar5 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar5[1].pos = local_38;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = (ImU32)local_b0;
    this->_VtxWritePtr = pIVar5 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar4 = this->_IdxWritePtr;
    *pIVar4 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar4 + 1;
    pIVar5[1].pos = local_40;
    pIVar5 = this->_VtxWritePtr;
    (pIVar5->uv).x = (float)local_228._0_4_;
    (pIVar5->uv).y = (float)local_228._4_4_;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = 0;
    this->_VtxWritePtr = pIVar5 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_228 = auVar35;
    ImDrawList::AddTriangle(this,&local_100,&local_38,&local_40,local_1c0,1.5);
    fVar29 = 1.0;
    if (local_248 <= 1.0) {
      fVar29 = local_248;
    }
    fVar29 = (float)(~-(uint)(local_248 < 0.0) & (uint)fVar29);
    fVar24 = 1.0 - local_244;
    fVar21 = 1.0;
    if (fVar24 <= 1.0) {
      fVar21 = fVar24;
    }
    fVar21 = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar21);
    fVar24 = fVar29 * (local_100.x - local_40.x) + local_40.x;
    fVar29 = fVar29 * (local_100.y - local_40.y) + local_40.y;
    local_f8.x = fVar21 * (local_38.x - fVar24) + fVar24;
    local_f8.y = fVar21 * (local_38.y - fVar29) + fVar29;
    uVar9 = local_188._0_4_;
    IVar11 = local_1c4;
  }
  if (local_23c._0_1_ == '\0') {
    fVar29 = 6.0;
  }
  else {
    fVar29 = 10.0;
  }
  local_228._0_4_ = fVar29;
  ImDrawList::AddCircleFilled(this,&local_f8,fVar29,IVar11,0xc);
  ImDrawList::AddCircle(this,&local_f8,(float)local_228._0_4_ + 1.0,local_1c0,0xc,1.0);
  ImDrawList::AddCircle(this,&local_f8,(float)local_228._0_4_,(ImU32)local_20c,0xc,1.0);
  if (local_1bc == 0x10000) {
    fVar29 = local_238[1].y;
    _local_208 = ZEXT416((uint)fVar29);
    fVar21 = 1.0;
    if (fVar29 <= 1.0) {
      fVar21 = fVar29;
    }
    _local_228 = ZEXT416((uint)(1.0 - fVar21));
    local_138._4_4_ = local_218.y;
    local_138._0_4_ = local_128._0_4_;
    local_130.x = (float)local_128._0_4_ + local_158;
    local_130.y = local_218.y + local_178;
    RenderColorRectWithAlphaCheckerboard
              (this,(ImVec2)local_138,local_130,0,(local_130.x - (float)local_128._0_4_) * 0.5,
               (ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_138,&local_130,IVar11,IVar11,IVar11 & 0xffffff,IVar11 & 0xffffff
              );
    local_228._4_4_ = (float)(int)(float)(~local_208._4_4_ & local_228._4_4_);
    local_228._0_4_ =
         (float)(int)((float)(-(uint)((float)local_208._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_208._0_4_ < 0.0) & local_228._0_4_) * local_178 +
                      local_218.y + 0.5);
    uStack_220._0_4_ = (uint)(float)(int)(float)(~(uint)fStack_200 & (uint)uStack_220);
    uStack_220._4_4_ = (float)(int)(float)(~(uint)fStack_1fc & (uint)uStack_220._4_4_);
    RenderFrameBorder((ImVec2)local_138,local_130,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_228._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_158 + 2.0,(pIVar15->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar9 != '\0') {
    iVar22 = bcmp(local_58,local_238,local_b8);
    uVar9 = uVar9 & 0xff;
    if (iVar22 == 0) {
      uVar9 = 0;
    }
  }
  bVar13 = (byte)uVar9;
  if ((uVar9 & 1) != 0) {
    MarkItemEdited((pIVar15->LastItemData).ID);
  }
  PopID();
LAB_00150857:
  return (bool)(bVar13 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}